

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_hash.hpp
# Opt level: O2

uchar assert_hash::details::file_hash_impl<unsigned_char>(uchar value,char *file,uint exponent)

{
  uint uVar1;
  
  while( true ) {
    uVar1 = exponent;
    if (*file == '\0') break;
    value = value + (*file << ((char)uVar1 * '\b' & 0x1fU));
    file = file + 1;
    exponent = uVar1 + 1;
    if (uVar1 == 0) {
      exponent = uVar1;
    }
  }
  return value;
}

Assistant:

constexpr T file_hash_impl( const T value, const char* const file, unsigned exponent )
        {
            return *file == 0
                ? value
                : file_hash_impl( add_char< T >( value, file, exponent ), file + 1, next_exponent< T >( exponent ) );
        }